

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosString.cpp
# Opt level: O1

string * adios2::helper::AddExtension(string *__return_storage_ptr__,string *name,string *extension)

{
  pointer pcVar1;
  long lVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + name->_M_string_length);
  lVar2 = std::__cxx11::string::find((char *)name,(ulong)(extension->_M_dataplus)._M_p,0);
  if (lVar2 != name->_M_string_length - 3) {
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)(extension->_M_dataplus)._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AddExtension(const std::string &name, const std::string extension) noexcept
{
    std::string result(name);
    if (name.find(extension) != name.size() - 3)
    {
        result += extension;
    }
    return result;
}